

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O0

any * __thiscall
Omega_h::InputYamlReader::map_item
          (any *__return_storage_ptr__,InputYamlReader *this,any *key_any,any *value_any)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  type_info *ptVar3;
  InputScalar *this_00;
  InputList *pIVar4;
  InputMap *pIVar5;
  char *pcVar6;
  ParserFail *this_01;
  allocator local_121;
  string local_120 [8];
  string msg;
  undefined1 local_100 [8];
  InputMap value_2;
  InputList value_1;
  string value;
  undefined1 local_58 [8];
  NameValue result;
  any *value_any_local;
  any *key_any_local;
  InputYamlReader *this_local;
  
  result.value.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value_any;
  NameValue::NameValue((NameValue *)local_58);
  pbVar2 = any_cast<std::__cxx11::string&&>(key_any);
  std::__cxx11::string::operator=((string *)local_58,(string *)pbVar2);
  ptVar3 = any::type((any *)result.value.
                            super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi);
  bVar1 = std::type_info::operator==(ptVar3,(type_info *)&std::__cxx11::string::typeinfo);
  if (bVar1) {
    pbVar2 = any_cast<std::__cxx11::string&&>
                       ((any *)result.value.
                               super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
    std::__cxx11::string::string
              ((string *)
               &value_1.entries.
                super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pbVar2);
    this_00 = (InputScalar *)operator_new(0x38);
    InputScalar::InputScalar
              (this_00,(string *)
                       &value_1.entries.
                        super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>::reset<Omega_h::InputScalar>
              ((__shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2> *)&result.field_0x18,
               this_00);
    std::__cxx11::string::~string
              ((string *)
               &value_1.entries.
                super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    ptVar3 = any::type((any *)result.value.
                              super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi);
    bVar1 = std::type_info::operator==(ptVar3,(type_info *)&InputList::typeinfo);
    if (bVar1) {
      pIVar4 = any_cast<Omega_h::InputList&&>
                         ((any *)result.value.
                                 super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
      InputList::InputList
                ((InputList *)&value_2.map._M_t._M_impl.super__Rb_tree_header._M_node_count,pIVar4);
      pIVar4 = (InputList *)operator_new(0x30);
      InputList::InputList
                (pIVar4,(InputList *)&value_2.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>::reset<Omega_h::InputList>
                ((__shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2> *)&result.field_0x18,
                 pIVar4);
      InputList::~InputList
                ((InputList *)&value_2.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      ptVar3 = any::type((any *)result.value.
                                super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi);
      bVar1 = std::type_info::operator==(ptVar3,(type_info *)&InputMap::typeinfo);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_120,"unexpected YAML map value type ",&local_121);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
        ptVar3 = any::type((any *)result.value.
                                  super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi);
        pcVar6 = std::type_info::name(ptVar3);
        std::__cxx11::string::operator+=(local_120,pcVar6);
        std::__cxx11::string::operator+=(local_120," for name \"");
        std::__cxx11::string::operator+=(local_120,(string *)local_58);
        std::__cxx11::string::operator+=(local_120,"\"\n");
        this_01 = (ParserFail *)__cxa_allocate_exception(0x10);
        ParserFail::ParserFail(this_01,(string *)local_120);
        __cxa_throw(this_01,&ParserFail::typeinfo,ParserFail::~ParserFail);
      }
      pIVar5 = any_cast<Omega_h::InputMap&&>
                         ((any *)result.value.
                                 super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
      InputMap::InputMap((InputMap *)local_100,pIVar5);
      pIVar5 = (InputMap *)operator_new(0x48);
      InputMap::InputMap(pIVar5,(InputMap *)local_100);
      std::__shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>::reset<Omega_h::InputMap>
                ((__shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2> *)&result.field_0x18,
                 pIVar5);
      InputMap::~InputMap((InputMap *)local_100);
    }
  }
  any::any<Omega_h::NameValue,void>(__return_storage_ptr__,(NameValue *)local_58);
  NameValue::~NameValue((NameValue *)local_58);
  return __return_storage_ptr__;
}

Assistant:

any map_item(any& key_any, any& value_any) {
    NameValue result;
    result.name = any_cast<std::string&&>(std::move(key_any));
    if (value_any.type() == typeid(std::string)) {
      std::string value = any_cast<std::string&&>(std::move(value_any));
      result.value.reset(new InputScalar(value));
    } else if (value_any.type() == typeid(InputList)) {
      InputList value = any_cast<InputList&&>(std::move(value_any));
      result.value.reset(new InputList(std::move(value)));
    } else if (value_any.type() == typeid(InputMap)) {
      InputMap value = any_cast<InputMap&&>(std::move(value_any));
      result.value.reset(new InputMap(std::move(value)));
    } else {
      std::string msg = "unexpected YAML map value type ";
      msg += value_any.type().name();
      msg += " for name \"";
      msg += result.name;
      msg += "\"\n";
      throw ParserFail(msg);
    }
    return any(std::move(result));
  }